

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O2

ze_result_t
driver::zetCommandListAppendMarkerExp
          (zet_command_list_handle_t hCommandList,zet_metric_group_handle_t hMetricGroup,
          uint32_t value)

{
  ze_result_t zVar1;
  
  if (DAT_0010d810 != (code *)0x0) {
    zVar1 = (*DAT_0010d810)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetCommandListAppendMarkerExp(
        zet_command_list_handle_t hCommandList,         ///< [in] handle to the command list
        zet_metric_group_handle_t hMetricGroup,         ///< [in] handle to the marker metric group.
                                                        ///< ::zet_metric_group_type_exp_flags_t could be used to check whether
                                                        ///< marker is supoported by the metric group.
        uint32_t value                                  ///< [in] marker value
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnAppendMarkerExp = context.zetDdiTable.CommandListExp.pfnAppendMarkerExp;
        if( nullptr != pfnAppendMarkerExp )
        {
            result = pfnAppendMarkerExp( hCommandList, hMetricGroup, value );
        }
        else
        {
            // generic implementation
        }

        return result;
    }